

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeSetStopTime(void *cvode_mem,realtype tstop)

{
  char *in_RDI;
  CVodeMem in_XMM0_Qa;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (char *)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetStopTime","cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if ((*(long *)(in_RDI + 0x358) < 1) ||
          (0.0 <= ((double)in_XMM0_Qa - *(double *)(in_RDI + 0x168)) * *(double *)(in_RDI + 0x140)))
  {
    *(CVodeMem *)(in_RDI + 0x118) = in_XMM0_Qa;
    in_RDI[0x110] = '\x01';
    in_RDI[0x111] = '\0';
    in_RDI[0x112] = '\0';
    in_RDI[0x113] = '\0';
    local_4 = 0;
  }
  else {
    cvProcessError(in_XMM0_Qa,*(int *)(in_RDI + 0x168),in_RDI,(char *)0xffffffea,"CVODE",
                   "CVodeSetStopTime",
                   "The value tstop = %lg is behind current t = %lg in the direction of integration."
                  );
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeSetStopTime(void *cvode_mem, realtype tstop)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetStopTime", MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem) cvode_mem;

  /* If CVode was called at least once, test if tstop is legal
   * (i.e. if it was not already passed).
   * If CVodeSetStopTime is called before the first call to CVode,
   * tstop will be checked in CVode. */
  if (cv_mem->cv_nst > 0) {

    if ( (tstop - cv_mem->cv_tn) * cv_mem->cv_h < ZERO ) {
      cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetStopTime", MSGCV_BAD_TSTOP, tstop, cv_mem->cv_tn);
      return(CV_ILL_INPUT);
    }

  }

  cv_mem->cv_tstop = tstop;
  cv_mem->cv_tstopset = SUNTRUE;

  return(CV_SUCCESS);
}